

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O2

ivec4 ImageCodec::decodeSINT_SINTVec<short,1>(ImageCodec *param_1,void *ptr)

{
  return (anon_union_16_4_ea85571f_for_vec<4,_int,_(glm::precision)0>_3)ZEXT416((uint)(int)*ptr);
}

Assistant:

static glm::ivec4 decodeSINT_SINTVec(const ImageCodec*, const void* ptr) {
        static_assert(std::is_signed_v<TYPE>);
        static_assert((COMPONENTS > 0) && (COMPONENTS <= 4));
        auto data = reinterpret_cast<const TYPE*>(ptr);
        glm::ivec4 result(0, 0, 0, 0);
        for (int i = 0; i < COMPONENTS; ++i)
            result[i] = data[i];
        return result;
    }